

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RsElseClauseSyntax::setChild
          (RsElseClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  RsProdItemSyntax *pRVar2;
  Token TVar3;
  
  if (index == 0) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->keyword).kind = TVar3.kind;
    (this->keyword).field_0x2 = TVar3._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->keyword).rawLen = TVar3.rawLen;
    (this->keyword).info = TVar3.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pRVar2 = (RsProdItemSyntax *)0x0;
    }
    else {
      pRVar2 = (RsProdItemSyntax *)TokenOrSyntax::node(&child);
    }
    (this->item).ptr = pRVar2;
  }
  return;
}

Assistant:

void RsElseClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: item = child.node() ? &child.node()->as<RsProdItemSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}